

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-unix.c++
# Opt level: O0

void __thiscall kj::UnixEventPort::wake(UnixEventPort *this)

{
  int osErrorNumber;
  void *pvVar1;
  Fault local_60;
  Fault f_1;
  Fault local_48;
  Fault f;
  SyscallResult local_24;
  undefined1 auStack_20 [4];
  SyscallResult _kjSyscallResult;
  ssize_t n;
  uint64_t one;
  UnixEventPort *this_local;
  
  f.exception = (Exception *)auStack_20;
  local_24 = _::Debug::syscall<kj::UnixEventPort::wake()const::__0>
                       ((anon_class_24_3_c5cf5cff *)&f,true);
  pvVar1 = _::Debug::SyscallResult::operator_cast_to_void_(&local_24);
  if (pvVar1 == (void *)0x0) {
    osErrorNumber = _::Debug::SyscallResult::getErrorNumber(&local_24);
    _::Debug::Fault::Fault
              (&local_48,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-unix.c++"
               ,0x1ac,osErrorNumber,"n = write(eventFd, &one, sizeof(one))","");
    _::Debug::Fault::fatal(&local_48);
  }
  if (-1 < (long)_auStack_20 && _auStack_20 != (char *)0x8) {
    _::Debug::Fault::Fault
              (&local_60,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-unix.c++"
               ,0x1ad,FAILED,"n < 0 || n == sizeof(one)","");
    _::Debug::Fault::fatal(&local_60);
  }
  return;
}

Assistant:

void UnixEventPort::wake() const {
  uint64_t one = 1;
  ssize_t n;
  KJ_NONBLOCKING_SYSCALL(n = write(eventFd, &one, sizeof(one)));
  KJ_ASSERT(n < 0 || n == sizeof(one));
}